

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O3

void opus_ifft_c(kiss_fft_state *st,kiss_fft_cpx *fin,kiss_fft_cpx *fout)

{
  int iVar1;
  long lVar2;
  
  if (0 < st->nfft) {
    lVar2 = 0;
    do {
      fout[st->bitrev[lVar2]] = fin[lVar2];
      lVar2 = lVar2 + 1;
      iVar1 = st->nfft;
    } while (lVar2 < iVar1);
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        fout[lVar2].i = -fout[lVar2].i;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
  }
  opus_fft_impl(st,fout);
  iVar1 = st->nfft;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      fout[lVar2].i = -fout[lVar2].i;
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  return;
}

Assistant:

void opus_ifft_c(const kiss_fft_state *st, const kiss_fft_cpx *fin, kiss_fft_cpx *fout) {
    int i;
    celt_assert2 (fin != fout, "In-place FFT not supported");
    /* Bit-reverse the input */
    for (i = 0; i < st->nfft; i++)
        fout[st->bitrev[i]] = fin[i];
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
    opus_fft_impl(st, fout);
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
}